

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

data_node_type * __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
split_upwards(Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *this,double key,int stop_propagation_level,
             vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  int *piVar1;
  longlong *plVar2;
  uint8_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  model_node_type *pmVar8;
  _func_int **pp_Var9;
  double dVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  double dVar13;
  bool bVar14;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true> *this_00
  ;
  pointer ppAVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  data_node_type *pdVar19;
  ostream *poVar20;
  ulong uVar21;
  data_node_type *pdVar22;
  data_node_type *pdVar23;
  self_type *psVar24;
  long *plVar25;
  undefined1 *puVar26;
  long lVar27;
  pointer pTVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  byte bVar32;
  data_node_type *pdVar33;
  pointer ppAVar34;
  pointer pTVar35;
  data_node_type *pdVar36;
  ulong uVar37;
  uint uVar38;
  undefined7 in_register_00000089;
  int iVar39;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *pAVar40;
  byte bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  double dVar55;
  undefined8 in_XMM7_Qb;
  data_node_type *local_f8;
  data_node_type *local_f0;
  short *local_e8;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *local_c8;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *local_c0;
  undefined4 local_b4;
  data_node_type *local_b0;
  ulong local_a8;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *local_a0;
  vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  to_delete;
  
  local_b4 = (undefined4)CONCAT71(in_register_00000089,verbose);
  if (stop_propagation_level < this->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar35 = (traversal_path->
            super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pmVar8 = pTVar35[-1].node;
  iVar39 = pTVar35[-1].bucketID;
  pAVar40 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             *)pmVar8->children_[iVar39];
  uVar38 = 1 << ((pAVar40->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
  local_a8 = (ulong)uVar38;
  iVar39 = iVar39 - iVar39 % (int)uVar38;
  dVar53 = (double)iVar39;
  dVar10 = (double)(int)uVar38 * 0.5 + dVar53;
  iVar29 = iVar39 + uVar38;
  piVar1 = &(this->stats_).num_sideways_splits;
  *piVar1 = *piVar1 + 1;
  plVar2 = &(this->stats_).num_sideways_split_keys;
  *plVar2 = *plVar2 + (long)pAVar40->num_keys_;
  dVar55 = (double)pAVar40->num_right_out_of_bounds_inserts_ / (double)pAVar40->num_inserts_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar10;
  if (dVar55 <= 0.9) {
    bVar16 = 0;
LAB_0010fd06:
    bVar41 = 0;
  }
  else {
    auVar51._8_8_ = 0;
    auVar51._0_8_ = pAVar40->max_key_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = (pmVar8->super_AlexNode<double,_double>).model_.a_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pmVar8->super_AlexNode<double,_double>).model_.b_;
    auVar4 = vfmadd213sd_fma(auVar48,auVar51,auVar4);
    if ((auVar4._0_8_ < dVar53) || (dVar10 <= auVar4._0_8_)) {
      auVar52._0_8_ = (double)iVar29;
      auVar52._8_8_ = in_XMM7_Qb;
      uVar11 = vcmppd_avx512vl(auVar54,auVar4,2);
      uVar12 = vcmppd_avx512vl(auVar4,auVar52,1);
      bVar16 = (byte)uVar11 & 3 & (byte)uVar12;
      goto LAB_0010fd06;
    }
    bVar16 = 0;
    bVar41 = 1;
  }
  dVar50 = (double)pAVar40->num_left_out_of_bounds_inserts_ / (double)pAVar40->num_inserts_;
  if (dVar50 <= 0.9) {
    bVar17 = 0;
  }
  else {
    auVar49._8_8_ = 0;
    auVar49._0_8_ = pAVar40->min_key_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (pmVar8->super_AlexNode<double,_double>).model_.a_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pmVar8->super_AlexNode<double,_double>).model_.b_;
    auVar4 = vfmadd213sd_fma(auVar45,auVar49,auVar5);
    if ((dVar53 <= auVar4._0_8_) && (auVar4._0_8_ < dVar10)) {
      bVar17 = 0;
      bVar32 = 1;
      goto LAB_0010fda0;
    }
    auVar42._0_8_ = (double)iVar29;
    auVar42._8_8_ = in_XMM7_Qb;
    uVar11 = vcmppd_avx512vl(auVar54,auVar4,2);
    uVar12 = vcmppd_avx512vl(auVar4,auVar42,1);
    bVar17 = (byte)uVar11 & 3 & (byte)uVar12;
  }
  bVar32 = 0;
LAB_0010fda0:
  local_c8 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *)((dVar10 - (pmVar8->super_AlexNode<double,_double>).model_.b_) /
                (pmVar8->super_AlexNode<double,_double>).model_.a_);
  local_c0 = this;
  local_a0 = traversal_path;
  iVar18 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           ::lower_bound<double>(pAVar40,(double *)&local_c8);
  this_00 = local_c0;
  pdVar19 = bulk_load_leaf_node_from_existing
                      (local_c0,pAVar40,0,iVar18,true,(FTNode *)0x0,reuse_model,
                       (bool)(0.9 < dVar55 & bVar41),(bool)(0.9 < dVar50 & bVar32));
  local_b0 = bulk_load_leaf_node_from_existing
                       (this_00,pAVar40,iVar18,pAVar40->data_capacity_,true,(FTNode *)0x0,
                        reuse_model,(bool)(0.9 < dVar55 & bVar16),(bool)(0.9 < dVar50 & bVar17));
  (pdVar19->super_AlexNode<double,_double>).duplication_factor_ =
       (pAVar40->super_AlexNode<double,_double>).duplication_factor_;
  (local_b0->super_AlexNode<double,_double>).duplication_factor_ =
       (pAVar40->super_AlexNode<double,_double>).duplication_factor_;
  (pdVar19->super_AlexNode<double,_double>).level_ =
       (pAVar40->super_AlexNode<double,_double>).level_;
  (local_b0->super_AlexNode<double,_double>).level_ =
       (pAVar40->super_AlexNode<double,_double>).level_;
  psVar24 = pAVar40->prev_leaf_;
  if (psVar24 != (self_type *)0x0) {
    psVar24->next_leaf_ = pdVar19;
  }
  pdVar19->prev_leaf_ = psVar24;
  pdVar19->next_leaf_ = local_b0;
  local_b0->prev_leaf_ = pdVar19;
  local_b0->next_leaf_ = pAVar40->next_leaf_;
  if (pAVar40->next_leaf_ != (self_type *)0x0) {
    pAVar40->next_leaf_->prev_leaf_ = local_b0;
  }
  local_c8 = pAVar40;
  if (to_delete.
      super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      to_delete.
      super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>::
    _M_realloc_insert<alex::AlexNode<double,double>*>
              ((vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>
                *)&to_delete,
               (iterator)
               to_delete.
               super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<double,_double> **)&local_c8);
  }
  else {
    *to_delete.
     super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
     ._M_impl.super__Vector_impl_data._M_finish = (AlexNode<double,_double> *)pAVar40;
    to_delete.
    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         to_delete.
         super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  piVar1 = &(local_c0->stats_).num_data_nodes;
  *piVar1 = *piVar1 + -1;
  if ((char)local_b4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Splitting upwards data node] level ",0x24);
    poVar20 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,(pAVar40->super_AlexNode<double,_double>).level_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node addr: ",0xd);
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node repeats in parent: ",0x1a);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node indexes in parent: [",0x1b);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", left leaf indexes: [0, ",0x19);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", right leaf indexes: [",0x17);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,pAVar40->data_capacity_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", new nodes addr: ",0x12);
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,",",1);
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
  }
  dVar53 = (pmVar8->super_AlexNode<double,_double>).model_.a_;
  dVar55 = (pmVar8->super_AlexNode<double,_double>).model_.b_;
  pTVar28 = (local_a0->
            super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar31 = (long)(local_a0->
                 super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar28;
  uVar37 = uVar31 >> 4;
  iVar29 = (int)uVar37;
  uVar31 = (long)(uVar31 * 0x10000000 + -0x100000000) >> 0x20;
  pTVar35 = pTVar28 + uVar31;
  pAVar40 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             *)pTVar28[uVar31].node;
  iVar39 = (int)(pAVar40->super_AlexNode<double,_double>).level_;
  if (stop_propagation_level < iVar39) {
    puVar26 = &local_c0->field_0xc9;
    local_f0 = local_b0;
    pdVar33 = pdVar19;
    do {
      uVar21 = uVar31;
      local_e8 = &(pAVar40->super_AlexNode<double,_double>).level_;
      piVar1 = &(local_c0->stats_).num_model_node_splits;
      *piVar1 = *piVar1 + 1;
      iVar39 = *(int *)&pAVar40->allocator_;
      plVar2 = &(local_c0->stats_).num_model_node_split_pointers;
      *plVar2 = *plVar2 + (long)iVar39;
      iVar29 = pTVar35->bucketID;
      iVar39 = iVar39 / 2;
      if (iVar29 < iVar39) {
        lVar27 = (long)iVar39;
        if (1 << (*(byte *)((long)(&(pAVar40->next_leaf_->super_AlexNode<double,_double>).
                                    _vptr_AlexNode)[lVar27] + 9) & 0x1f) == iVar39) {
          pdVar22 = (data_node_type *)operator_new(0x40);
          local_a8 = CONCAT71((int7)((ulong)lVar27 >> 8),1);
          bVar14 = false;
          pdVar36 = (data_node_type *)0x0;
          pdVar23 = pdVar22;
        }
        else {
LAB_0011022b:
          pdVar23 = (data_node_type *)operator_new(0x40);
          sVar7 = *local_e8;
          (pdVar23->super_AlexNode<double,_double>).is_leaf_ = false;
          (pdVar23->super_AlexNode<double,_double>).duplication_factor_ = '\0';
          (pdVar23->super_AlexNode<double,_double>).level_ = sVar7;
          (pdVar23->super_AlexNode<double,_double>).model_.a_ = 0.0;
          (pdVar23->super_AlexNode<double,_double>).model_.b_ = 0.0;
          (pdVar23->super_AlexNode<double,_double>).cost_ = 0.0;
          (pdVar23->super_AlexNode<double,_double>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_0011acc8;
          pdVar23->key_less_ = (AlexCompare *)puVar26;
          *(undefined4 *)&pdVar23->allocator_ = 0;
          local_a8 = 0;
          pdVar23->next_leaf_ = (self_type *)0x0;
          pdVar22 = (data_node_type *)operator_new(0x40);
          bVar14 = false;
          pdVar36 = pdVar22;
        }
      }
      else {
        if (1 << (*(byte *)((long)(pAVar40->next_leaf_->super_AlexNode<double,_double>).
                                  _vptr_AlexNode + 9) & 0x1f) != iVar39) goto LAB_0011022b;
        pdVar22 = (data_node_type *)operator_new(0x40);
        bVar14 = true;
        local_a8 = 0;
        pdVar23 = (data_node_type *)0x0;
        pdVar36 = pdVar22;
      }
      sVar7 = *local_e8;
      (pdVar22->super_AlexNode<double,_double>).is_leaf_ = false;
      (pdVar22->super_AlexNode<double,_double>).duplication_factor_ = '\0';
      (pdVar22->super_AlexNode<double,_double>).level_ = sVar7;
      (pdVar22->super_AlexNode<double,_double>).model_.a_ = 0.0;
      (pdVar22->super_AlexNode<double,_double>).model_.b_ = 0.0;
      (pdVar22->super_AlexNode<double,_double>).cost_ = 0.0;
      (pdVar22->super_AlexNode<double,_double>)._vptr_AlexNode =
           (_func_int **)&PTR__AlexModelNode_0011acc8;
      pdVar22->key_less_ = (AlexCompare *)puVar26;
      *(undefined4 *)&pdVar22->allocator_ = 0;
      pdVar22->next_leaf_ = (self_type *)0x0;
      local_f8._0_4_ = (int)uVar37;
      local_f8 = pdVar23;
      if (iVar29 < iVar39) {
        if (pdVar23 == (data_node_type *)0x0) {
          __assert_fail("left_split != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                        ,0x7b2,
                        "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                       );
        }
        if ((int)local_f8 ==
            (int)((ulong)((long)(local_a0->
                                super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_a0->
                               super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)pdVar23;
        }
        iVar39 = *(int *)&pAVar40->allocator_;
        *(int *)&pdVar23->allocator_ = iVar39;
        psVar24 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                            ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_c8,
                             (long)iVar39,(void *)0x0);
        pdVar23->next_leaf_ = psVar24;
        dVar50 = (pAVar40->super_AlexNode<double,_double>).model_.a_;
        dVar13 = (pAVar40->super_AlexNode<double,_double>).model_.b_;
        (pdVar23->super_AlexNode<double,_double>).model_.a_ = dVar50 + dVar50;
        (pdVar23->super_AlexNode<double,_double>).model_.b_ = dVar13 + dVar13;
        iVar39 = *(int *)&pAVar40->allocator_ / 2;
        iVar29 = 0;
        if (1 < *(int *)&pAVar40->allocator_) {
          iVar29 = 0;
          do {
            pp_Var9 = (&(pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)
                      [iVar29];
            bVar16 = *(byte *)((long)pp_Var9 + 9);
            if (bVar16 != 0x1f) {
              lVar27 = (long)(iVar29 * 2);
              do {
                (&(pdVar23->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
                     pp_Var9;
                lVar27 = lVar27 + 1;
              } while ((2 << (bVar16 & 0x1f)) + iVar29 * 2 != lVar27);
            }
            iVar29 = iVar29 + (1 << (bVar16 & 0x1f));
            *(byte *)((long)pp_Var9 + 9) = bVar16 + 1;
          } while (iVar29 < iVar39);
        }
        if (iVar29 != iVar39) {
          __assert_fail("cur == cur_node->num_children_ / 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                        ,0x7c6,
                        "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                       );
        }
        if ((char)local_a8 == '\0') {
          *(int *)&pdVar36->allocator_ = iVar39;
          psVar24 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                              ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_c8,
                               (long)iVar39,(void *)0x0);
          pdVar36->next_leaf_ = psVar24;
          (pdVar36->super_AlexNode<double,_double>).model_.a_ =
               (pAVar40->super_AlexNode<double,_double>).model_.a_;
          iVar39 = *(int *)&pAVar40->allocator_;
          (pdVar36->super_AlexNode<double,_double>).model_.b_ =
               (pAVar40->super_AlexNode<double,_double>).model_.b_ - (double)(iVar39 / 2);
          if (0 < (long)iVar39) {
            uVar31 = (ulong)(uint)(iVar39 / 2);
            lVar27 = 0;
            do {
              *(_func_int ***)
               ((long)&(pdVar36->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode + lVar27
               ) = (&(pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[uVar31];
              uVar31 = uVar31 + 1;
              lVar27 = lVar27 + 8;
            } while (uVar31 < (ulong)(long)iVar39);
          }
        }
        else {
          pdVar36 = (data_node_type *)
                    (&(pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[iVar39];
          (pdVar36->super_AlexNode<double,_double>).level_ = *local_e8;
        }
        iVar29 = pTVar35->bucketID * 2;
        iVar18 = 2 << ((pdVar33->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
        iVar29 = iVar29 - iVar29 % iVar18;
        iVar39 = (iVar18 >> 1) + iVar29;
        if (0 < iVar18 >> 1) {
          lVar27 = (long)iVar29;
          do {
            (&(pdVar23->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
                 (_func_int **)pdVar33;
            lVar27 = lVar27 + 1;
          } while (lVar27 < iVar39);
        }
        if (0 < iVar18) {
          lVar27 = (long)iVar39;
          do {
            (&(pdVar23->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
                 (_func_int **)local_f0;
            lVar27 = lVar27 + 1;
          } while (lVar27 < iVar29 + iVar18);
        }
      }
      else {
        if (pdVar36 == (data_node_type *)0x0) {
          __assert_fail("right_split != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                        ,0x7ed,
                        "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                       );
        }
        if ((int)local_f8 ==
            (int)((ulong)((long)(local_a0->
                                super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_a0->
                               super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)pdVar36;
        }
        if (bVar14) {
          local_f8 = (data_node_type *)
                     (pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode;
          (local_f8->super_AlexNode<double,_double>).level_ = *local_e8;
        }
        else {
          iVar39 = *(int *)&pAVar40->allocator_ / 2;
          *(int *)&pdVar23->allocator_ = iVar39;
          psVar24 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                              ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_c8,
                               (long)iVar39,(void *)0x0);
          pdVar23->next_leaf_ = psVar24;
          dVar50 = (pAVar40->super_AlexNode<double,_double>).model_.b_;
          (pdVar23->super_AlexNode<double,_double>).model_.a_ =
               (pAVar40->super_AlexNode<double,_double>).model_.a_;
          (pdVar23->super_AlexNode<double,_double>).model_.b_ = dVar50;
          uVar38 = *(uint *)&pAVar40->allocator_;
          if (1 < (int)uVar38) {
            uVar31 = 0;
            do {
              (&(pdVar23->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[uVar31] =
                   (&(pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[uVar31];
              uVar31 = uVar31 + 1;
            } while (uVar38 >> 1 != uVar31);
          }
        }
        iVar39 = *(int *)&pAVar40->allocator_;
        *(int *)&pdVar36->allocator_ = iVar39;
        psVar24 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                            ((new_allocator<alex::AlexNode<double,_double>_*> *)&local_c8,
                             (long)iVar39,(void *)0x0);
        pdVar36->next_leaf_ = psVar24;
        uVar38 = *(uint *)&pAVar40->allocator_;
        uVar30 = (int)uVar38 / 2;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (pAVar40->super_AlexNode<double,_double>).model_.a_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = (pAVar40->super_AlexNode<double,_double>).model_.b_ - (double)(int)uVar30;
        auVar54 = vunpcklpd_avx(auVar46,auVar43);
        (pdVar36->super_AlexNode<double,_double>).model_.a_ = auVar54._0_8_ + auVar54._0_8_;
        (pdVar36->super_AlexNode<double,_double>).model_.b_ = auVar54._8_8_ + auVar54._8_8_;
        if (0 < (int)uVar38) {
          do {
            pp_Var9 = (&(pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)
                      [(int)uVar30];
            bVar16 = *(byte *)((long)pp_Var9 + 9);
            if (bVar16 != 0x1f) {
              lVar27 = (long)(int)((uVar30 - (uVar38 >> 1)) * 2);
              do {
                (&(pdVar36->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
                     pp_Var9;
                lVar27 = lVar27 + 1;
              } while ((int)((2 << (bVar16 & 0x1f)) + (uVar30 * 2 - (uVar38 & 0x7ffffffe))) !=
                       lVar27);
            }
            *(byte *)((long)pp_Var9 + 9) = bVar16 + 1;
            uVar30 = uVar30 + (1 << (bVar16 & 0x1f));
          } while ((int)uVar30 < (int)uVar38);
        }
        if (uVar30 != uVar38) {
          __assert_fail("cur == cur_node->num_children_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                        ,0x816,
                        "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                       );
        }
        iVar29 = (pTVar35->bucketID - (uVar38 - ((int)uVar38 >> 0x1f) >> 1)) * 2;
        iVar18 = 2 << ((pdVar33->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
        iVar29 = iVar29 - iVar29 % iVar18;
        iVar39 = (iVar18 >> 1) + iVar29;
        if (0 < iVar18 >> 1) {
          lVar27 = (long)iVar29;
          do {
            (&(pdVar36->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
                 (_func_int **)pdVar33;
            lVar27 = lVar27 + 1;
          } while (lVar27 < iVar39);
        }
        if (0 < iVar18) {
          lVar27 = (long)iVar39;
          do {
            (&(pdVar36->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
                 (_func_int **)local_f0;
            lVar27 = lVar27 + 1;
          } while (lVar27 < iVar29 + iVar18);
        }
      }
      if ((pdVar36 == (data_node_type *)0x0) || (local_f8 == (data_node_type *)0x0)) {
        __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x829,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      if ((char)local_b4 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[Splitting upwards through-node] level ",0x27);
        poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node addr: ",0xd);
        poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node children: ",0x11);
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,pTVar35->node->num_children_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,", child index: ",0xf);
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,pTVar35->bucketID);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,", child repeats in node: ",0x19)
        ;
        poVar20 = (ostream *)
                  std::ostream::operator<<
                            (poVar20,1 << ((pdVar33->super_AlexNode<double,_double>).
                                           duplication_factor_ & 0x1f));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20,", node repeats in parent: ",0x1a);
        poVar20 = (ostream *)
                  std::ostream::operator<<
                            (poVar20,1 << ((pTVar35->node->super_AlexNode<double,_double>).
                                           duplication_factor_ & 0x1f));
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,", new nodes addr: ",0x12);
        poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,",",1);
        poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
        std::ostream::put((char)poVar20);
        std::ostream::flush();
      }
      local_c8 = pAVar40;
      if (to_delete.
          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          to_delete.
          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>::
        _M_realloc_insert<alex::AlexNode<double,double>*>
                  ((vector<alex::AlexNode<double,double>*,std::allocator<alex::AlexNode<double,double>*>>
                    *)&to_delete,
                   (iterator)
                   to_delete.
                   super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<double,_double> **)&local_c8
                  );
      }
      else {
        *to_delete.
         super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &pAVar40->super_AlexNode<double,_double>;
        to_delete.
        super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             to_delete.
             super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if ((char)local_a8 == '\0' && !bVar14) {
        piVar1 = &(local_c0->stats_).num_model_nodes;
        *piVar1 = *piVar1 + 1;
      }
      (local_f8->super_AlexNode<double,_double>).duplication_factor_ =
           (pAVar40->super_AlexNode<double,_double>).duplication_factor_;
      (pdVar36->super_AlexNode<double,_double>).duplication_factor_ =
           (pAVar40->super_AlexNode<double,_double>).duplication_factor_;
      uVar31 = uVar21 - 1;
      pTVar28 = (local_a0->
                super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pTVar35 = pTVar28 + uVar31;
      pAVar40 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                 *)pTVar28[uVar31].node;
      iVar39 = (int)(pAVar40->super_AlexNode<double,_double>).level_;
      uVar37 = uVar21 & 0xffffffff;
      pdVar33 = local_f8;
      local_f0 = pdVar36;
    } while (stop_propagation_level < iVar39);
    iVar29 = (int)uVar21;
  }
  else {
    local_f0 = local_b0;
    local_f8 = pdVar19;
  }
  if (iVar39 != stop_propagation_level) {
    __assert_fail("top_node->level_ == stop_propagation_level",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x846,
                  "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  if (iVar29 == (int)((ulong)((long)(local_a0->
                                    super__Vector_base<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar28) >>
                     4)) {
    *new_parent = (model_node_type *)pAVar40;
  }
  iVar39 = pTVar35->bucketID;
  bVar16 = (local_f8->super_AlexNode<double,_double>).duplication_factor_;
  iVar29 = 1 << (bVar16 & 0x1f);
  if ((char)local_b4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Splitting upwards top node] level ",0x23);
    poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,stop_propagation_level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node addr: ",0xd);
    poVar20 = std::ostream::_M_insert<void_const*>(poVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node children: ",0x11);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,*(int *)&pAVar40->allocator_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", child index: ",0xf);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", child repeats in node: ",0x19);
    poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,", node repeats in parent: ",0x1a);
    plVar25 = (long *)std::ostream::operator<<
                                (poVar20,1 << ((pAVar40->super_AlexNode<double,_double>).
                                               duplication_factor_ & 0x1f));
    std::ios::widen((char)*(undefined8 *)(*plVar25 + -0x18) + (char)plVar25);
    std::ostream::put((char)plVar25);
    std::ostream::flush();
  }
  if (bVar16 == 0) {
    piVar1 = &(local_c0->stats_).num_model_node_expansions;
    *piVar1 = *piVar1 + 1;
    plVar2 = &(local_c0->stats_).num_model_node_expansion_pointers;
    *plVar2 = *plVar2 + (long)*(int *)&pAVar40->allocator_;
    AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::expand
              ((AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)pAVar40
               ,1);
    iVar39 = iVar39 * 2;
    iVar29 = 2;
  }
  else {
    puVar3 = &(local_f8->super_AlexNode<double,_double>).duplication_factor_;
    *puVar3 = *puVar3 + 0xff;
    puVar3 = &(local_f0->super_AlexNode<double,_double>).duplication_factor_;
    *puVar3 = *puVar3 + 0xff;
  }
  ppAVar15 = to_delete.
             super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  iVar39 = iVar39 - iVar39 % iVar29;
  iVar18 = iVar29 / 2 + iVar39;
  if (1 < iVar29) {
    lVar27 = (long)iVar39;
    do {
      (&(pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
           (_func_int **)local_f8;
      lVar27 = lVar27 + 1;
    } while (lVar27 < iVar18);
  }
  ppAVar34 = to_delete.
             super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (0 < iVar29) {
    lVar27 = (long)iVar18;
    do {
      (&(pAVar40->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[lVar27] =
           (_func_int **)local_f0;
      lVar27 = lVar27 + 1;
    } while (lVar27 < iVar39 + iVar29);
  }
  for (; ppAVar34 != ppAVar15; ppAVar34 = ppAVar34 + 1) {
    delete_node(local_c0,*ppAVar34);
  }
  if (to_delete.
      super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(to_delete.
                    super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)to_delete.
                          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)to_delete.
                          super__Vector_base<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  auVar44._8_8_ = 0;
  auVar44._0_8_ = key;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar55;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar53;
  auVar54 = vfmadd132sd_fma(auVar44,auVar47,auVar6);
  if (auVar54._0_8_ < dVar10) {
    local_b0 = pdVar19;
  }
  return local_b0;
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }